

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vault.c
# Opt level: O0

void wallify_vault(monst *grd)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  boolean bVar9;
  obj *gold_00;
  trap *trap_00;
  char *pcVar10;
  monst *local_50;
  boolean movedgold;
  boolean fixed;
  trap *trap;
  obj *gold;
  monst *mon;
  xchar hiy;
  xchar loy;
  xchar hix;
  xchar lox;
  char tmp_viz;
  int vlt;
  int typ;
  int y;
  int x;
  monst *grd_local;
  
  iVar2 = *(int *)((long)&grd[1].nmon + 4);
  cVar5 = level->rooms[iVar2].lx + -1;
  cVar6 = level->rooms[iVar2].hx + '\x01';
  cVar7 = level->rooms[iVar2].ly + -1;
  cVar8 = level->rooms[iVar2].hy + '\x01';
  bVar4 = false;
  bVar3 = false;
  for (typ = (int)cVar5; typ <= cVar6; typ = typ + 1) {
    for (vlt = (int)cVar7; vlt <= cVar8; vlt = vlt + 1) {
      if (((((typ == cVar5) || (typ == cVar6)) || (vlt == cVar7)) || (vlt == cVar8)) &&
         (((level->locations[typ][vlt].typ == '\0' || ('\f' < level->locations[typ][vlt].typ)) &&
          (bVar9 = in_fcorridor(grd,typ,vlt), bVar9 == '\0')))) {
        if ((level->monsters[typ][vlt] == (monst *)0x0) ||
           ((*(uint *)&level->monsters[typ][vlt]->field_0x60 >> 9 & 1) != 0)) {
          local_50 = (monst *)0x0;
        }
        else {
          local_50 = level->monsters[typ][vlt];
        }
        if ((local_50 != (monst *)0x0) && (local_50 != grd)) {
          if (local_50->mtame != '\0') {
            yelp(local_50);
          }
          rloc(level,local_50,'\0');
        }
        gold_00 = gold_at(level,typ,vlt);
        if (gold_00 != (obj *)0x0) {
          move_gold(gold_00,*(int *)((long)&grd[1].nmon + 4));
          bVar3 = true;
        }
        trap_00 = t_at(level,typ,vlt);
        if (trap_00 != (trap *)0x0) {
          deltrap(level,trap_00);
        }
        if (typ == cVar5) {
          if (vlt == cVar7) {
            loy = '\x03';
          }
          else {
            loy = '\x01';
            if (vlt == cVar8) {
              loy = '\x05';
            }
          }
        }
        else if (typ == cVar6) {
          if (vlt == cVar7) {
            loy = '\x04';
          }
          else {
            loy = '\x01';
            if (vlt == cVar8) {
              loy = '\x06';
            }
          }
        }
        else {
          loy = '\x02';
        }
        level->locations[typ][vlt].typ = loy;
        *(uint *)&level->locations[typ][vlt].field_0x6 =
             *(uint *)&level->locations[typ][vlt].field_0x6 & 0xfffffe0f;
        cVar1 = viz_array[vlt][typ];
        viz_array[vlt][typ] = '\x03';
        newsym(typ,vlt);
        viz_array[vlt][typ] = cVar1;
        block_point(typ,vlt);
        bVar4 = true;
      }
    }
  }
  if ((bVar3) || (bVar4)) {
    bVar9 = in_fcorridor(grd,(int)grd->mx,(int)grd->my);
    if ((bVar9 == '\0') && ((viz_array[grd->my][grd->mx] & 2U) == 0)) {
      You_hear("a distant chant.");
    }
    else {
      pcVar10 = x_monnam(grd,0,(char *)0x0,1,'\0');
      pline("The %s whispers an incantation.",pcVar10);
    }
    if (bVar3) {
      pline("A mysterious force moves the gold into the vault.");
    }
    if (bVar4) {
      pline("The damaged vault\'s walls are magically restored!");
    }
  }
  return;
}

Assistant:

static void wallify_vault(struct monst *grd)
{
	int x, y, typ;
	int vlt = EGD(grd)->vroom;
	char tmp_viz;
	xchar lox = level->rooms[vlt].lx - 1, hix = level->rooms[vlt].hx + 1,
	      loy = level->rooms[vlt].ly - 1, hiy = level->rooms[vlt].hy + 1;
	struct monst *mon;
	struct obj *gold;
	struct trap *trap;
	boolean fixed = FALSE;
	boolean movedgold = FALSE;

	for (x = lox; x <= hix; x++)
	    for (y = loy; y <= hiy; y++) {
		/* if not on the room boundary, skip ahead */
		if (x != lox && x != hix && y != loy && y != hiy) continue;

		if (!IS_WALL(level->locations[x][y].typ) && !in_fcorridor(grd, x, y)) {
		    if ((mon = m_at(level, x, y)) != 0 && mon != grd) {
			if (mon->mtame) yelp(mon);
			rloc(level, mon, FALSE);
		    }
		    if ((gold = gold_at(level, x, y)) != 0) {
			move_gold(gold, EGD(grd)->vroom);
			movedgold = TRUE;
		    }
		    if ((trap = t_at(level, x, y)) != 0)
			deltrap(level, trap);
		    if (x == lox)
			typ = (y == loy) ? TLCORNER :
			      (y == hiy) ? BLCORNER : VWALL;
		    else if (x == hix)
			typ = (y == loy) ? TRCORNER :
			      (y == hiy) ? BRCORNER : VWALL;
		    else  /* not left or right side, must be top or bottom */
			typ = HWALL;
		    level->locations[x][y].typ = typ;
		    level->locations[x][y].doormask = 0;
		    /*
		     * hack: player knows walls are restored because of the
		     * message, below, so show this on the screen.
		     */
		    tmp_viz = viz_array[y][x];
		    viz_array[y][x] = IN_SIGHT|COULD_SEE;
		    newsym(x,y);
		    viz_array[y][x] = tmp_viz;
		    block_point(x,y);
		    fixed = TRUE;
		}
	    }

	if (movedgold || fixed) {
	    if (in_fcorridor(grd, grd->mx, grd->my) || cansee(grd->mx, grd->my))
		pline("The %s whispers an incantation.", g_monnam(grd));
	    else You_hear("a distant chant.");
	    if (movedgold)
		pline("A mysterious force moves the gold into the vault.");
	    if (fixed)
		pline("The damaged vault's walls are magically restored!");
	}
}